

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O3

REF_STATUS ref_list_contains(REF_LIST ref_list,REF_INT item,REF_BOOL *contains)

{
  long lVar1;
  
  *contains = 0;
  if (0 < (long)ref_list->n) {
    lVar1 = 0;
    do {
      if (ref_list->value[lVar1] == item) {
        *contains = 1;
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while (ref_list->n != lVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_list_contains(REF_LIST ref_list, REF_INT item,
                                     REF_BOOL *contains) {
  REF_INT i;

  *contains = REF_FALSE;

  for (i = 0; i < ref_list_n(ref_list); i++)
    if (ref_list->value[i] == item) {
      *contains = REF_TRUE;
      return REF_SUCCESS;
    }

  return REF_SUCCESS;
}